

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_do(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  tftp_state_data *ptVar3;
  tftp_state_data *state;
  
  pcVar1 = data->conn;
  *done = false;
  ptVar3 = (pcVar1->proto).tftpc;
  state = ptVar3;
  if (ptVar3 == (tftp_state_data *)0x0) {
    CVar2 = tftp_connect(data,done);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    ptVar3 = (pcVar1->proto).tftpc;
    if (ptVar3 == (tftp_state_data *)0x0) {
      return CURLE_TFTP_ILLEGAL;
    }
    state = (data->conn->proto).tftpc;
  }
  *done = false;
  CVar2 = tftp_state_machine(state,TFTP_EVENT_INIT);
  if (CVar2 == CURLE_OK && state->state != TFTP_STATE_FIN) {
    tftp_multi_statemach(data,done);
  }
  else if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  CVar2 = tftp_translate_code(ptVar3->error);
  return CVar2;
}

Assistant:

static CURLcode tftp_do(struct Curl_easy *data, bool *done)
{
  struct tftp_state_data *state;
  CURLcode result;
  struct connectdata *conn = data->conn;

  *done = FALSE;

  if(!conn->proto.tftpc) {
    result = tftp_connect(data, done);
    if(result)
      return result;
  }

  state = conn->proto.tftpc;
  if(!state)
    return CURLE_TFTP_ILLEGAL;

  result = tftp_perform(data, done);

  /* If tftp_perform() returned an error, use that for return code. If it
     was OK, see if tftp_translate_code() has an error. */
  if(!result)
    /* If we have encountered an internal tftp error, translate it. */
    result = tftp_translate_code(state->error);

  return result;
}